

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::addArg(CmdLine *this,ArgIface *arg)

{
  bool bVar1;
  BaseException *this_00;
  undefined8 uVar2;
  long *in_RSI;
  pointer in_stack_fffffffffffffe58;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_fffffffffffffe60;
  String *in_stack_fffffffffffffe68;
  allocator *paVar3;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_fffffffffffffe70;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  allocator local_121;
  string local_120 [39];
  undefined1 local_f9;
  undefined1 local_f8 [39];
  allocator local_d1;
  string local_d0 [103];
  Deleter<Args::ArgIface> local_69 [17];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_58;
  Deleter<Args::ArgIface> local_39 [17];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_28;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_20;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_18;
  long *local_10;
  
  if (in_RSI == (long *)0x0) {
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = &local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_120,"Attempt to add nullptr to the command line as argument.",paVar3);
    BaseException::BaseException
              ((BaseException *)in_stack_fffffffffffffe70._M_current,(String *)paVar3);
    __cxa_throw(uVar2,&BaseException::typeinfo,BaseException::~BaseException);
  }
  local_10 = in_RSI;
  local_20 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::begin((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                      *)in_stack_fffffffffffffe58);
  local_28 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::end((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                    *)in_stack_fffffffffffffe58);
  details::Deleter<Args::ArgIface>::Deleter(local_39,false);
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x10cb9d);
  local_18 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             find<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
                       (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                        (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                        in_stack_fffffffffffffe68);
  local_58 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::end((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                    *)in_stack_fffffffffffffe58);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_fffffffffffffe60,
                     (__normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_fffffffffffffe58);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            (in_stack_fffffffffffffe70._M_current);
  if (!bVar1) {
    local_f9 = 1;
    this_00 = (BaseException *)__cxa_allocate_exception(0x30);
    paVar3 = &local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Argument \"",paVar3);
    (**(code **)(*local_10 + 0x18))(local_f8);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
    BaseException::BaseException(this_00,in_stack_fffffffffffffe68);
    local_f9 = 0;
    __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
  }
  (**(code **)(*local_10 + 0x90))();
  details::Deleter<Args::ArgIface>::Deleter(local_69,false);
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x10cc78);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::push_back(in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            (in_stack_fffffffffffffe70._M_current);
  return;
}

Assistant:

inline void
CmdLine::addArg( ArgIface * arg )
{
	if( arg )
	{
		if( std::find( m_args.begin(), m_args.end(),
			ArgPtr( arg, details::Deleter< ArgIface > ( false ) ) ) ==
				m_args.end() )
		{
			arg->setCmdLine( this );

			m_args.push_back( ArgPtr( arg,
				details::Deleter< ArgIface > ( false ) ) );
		}
		else
			throw BaseException( String( SL( "Argument \"" ) ) +
				arg->name() + SL( "\" already in the command line parser." ) );
	}
	else
		throw BaseException( String( SL( "Attempt to add nullptr to the "
			"command line as argument." ) ) );
}